

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O1

void __thiscall
sjtu::LRUCache<sjtu::trainType>::CacheNode::CacheNode
          (CacheNode *this,trainType *value_,locType *offset_,LRUCache<sjtu::trainType> *bel_)

{
  char *pcVar1;
  undefined8 uVar2;
  locType lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  undefined6 uVar8;
  long lVar9;
  value_type local_50;
  pair<sjtu::map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_>::iterator,_bool>
  local_40;
  
  lVar9 = 0xa768;
  memcpy(this,value_,0xa768);
  do {
    uVar2 = *(undefined8 *)(value_->trainID + lVar9 + 8);
    pcVar1 = (this->value).trainID + lVar9;
    *(undefined8 *)pcVar1 = *(undefined8 *)(value_->trainID + lVar9);
    *(undefined8 *)(pcVar1 + 8) = uVar2;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0xa788);
  iVar4 = (value_->startTime).day;
  iVar5 = (value_->startTime).hour;
  iVar6 = (value_->startTime).minute;
  (this->value).startTime.month = (value_->startTime).month;
  (this->value).startTime.day = iVar4;
  (this->value).startTime.hour = iVar5;
  (this->value).startTime.minute = iVar6;
  bVar7 = value_->is_released;
  uVar8 = *(undefined6 *)&value_->field_0xa79a;
  lVar3 = value_->offset;
  (this->value).type = value_->type;
  (this->value).is_released = bVar7;
  *(undefined6 *)&(this->value).field_0xa79a = uVar8;
  (this->value).offset = lVar3;
  local_50.first = *offset_;
  this->offset = local_50.first;
  this->is_dirty_page = false;
  this->prec = (CacheNode *)0x0;
  this->succ = (CacheNode *)0x0;
  this->bel = bel_;
  local_50.second = this;
  map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_>::insert
            (&local_40,&bel_->table,&local_50);
  return;
}

Assistant:

CacheNode(const valueType &value_ , const locType &offset_ , LRUCache<valueType> *bel_) : value(value_) , offset(offset_) , bel(bel_) , is_dirty_page(false) , prec(nullptr) , succ(nullptr)
			{
				bel -> table.insert(std::make_pair(offset , this));
			}